

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O1

void __thiscall myEmployeeBoss::ArchiveOUT(myEmployeeBoss *this,ChArchiveOut *marchive)

{
  ChNameValue<myEmployee> local_38;
  
  chrono::ChArchiveOut::VersionWrite<myEmployeeBoss>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,marchive);
  local_38._value = (myEmployee *)&this->is_dumb;
  local_38._name = "is_dumb";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value = &this->slave;
  local_38._name = "slave";
  local_38._flags = '\0';
  chrono::ChArchiveOut::out<myEmployee>(marchive,&local_38);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeBoss>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);

        // stream out member data
        marchive << CHNVP(is_dumb);
        marchive << CHNVP(slave);  // this added only from version >1
    }